

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O0

SquareMatrix<double,_3> * __thiscall
OpenMD::Quaternion<double>::toRotationMatrix3(Quaternion<double> *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  Quaternion<double> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double z2;
  double y2;
  double x2;
  double w2;
  SquareMatrix<double,_3> *rotMat3;
  SquareMatrix<double,_3> *in_stack_fffffffffffffd60;
  
  SquareMatrix<double,_3>::SquareMatrix(in_stack_fffffffffffffd60);
  bVar3 = Vector<double,_4U>::isNormalized((Vector<double,_4U> *)0x166844);
  if (!bVar3) {
    Vector<double,_4U>::normalize((Vector<double,_4U> *)in_stack_fffffffffffffd60);
  }
  pdVar4 = w(in_RSI);
  dVar5 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar5 = dVar5 * *pdVar4;
  pdVar4 = x(in_RSI);
  dVar6 = *pdVar4;
  pdVar4 = x(in_RSI);
  dVar6 = dVar6 * *pdVar4;
  pdVar4 = y(in_RSI);
  dVar7 = *pdVar4;
  pdVar4 = y(in_RSI);
  dVar7 = dVar7 * *pdVar4;
  pdVar4 = z(in_RSI);
  dVar8 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar8 = dVar8 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,0);
  *pdVar4 = ((dVar5 + dVar6) - dVar7) - dVar8;
  pdVar4 = x(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = y(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar9 = dVar9 * dVar1 + dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,1);
  *pdVar4 = dVar9 + dVar9;
  pdVar4 = x(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = y(in_RSI);
  dVar9 = dVar9 * dVar1 - dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,2);
  *pdVar4 = dVar9 + dVar9;
  pdVar4 = x(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = y(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar9 = dVar9 * dVar1 - dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,0);
  *pdVar4 = dVar9 + dVar9;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,1);
  *pdVar4 = ((dVar5 - dVar6) + dVar7) - dVar8;
  pdVar4 = y(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = x(in_RSI);
  dVar9 = dVar9 * dVar1 + dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,2);
  *pdVar4 = dVar9 + dVar9;
  pdVar4 = x(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = y(in_RSI);
  dVar9 = dVar9 * dVar1 + dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,0);
  *pdVar4 = dVar9 + dVar9;
  pdVar4 = y(in_RSI);
  dVar9 = *pdVar4;
  pdVar4 = z(in_RSI);
  dVar1 = *pdVar4;
  pdVar4 = w(in_RSI);
  dVar2 = *pdVar4;
  pdVar4 = x(in_RSI);
  dVar9 = dVar9 * dVar1 - dVar2 * *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,1);
  *pdVar4 = dVar9 + dVar9;
  dVar8 = ((dVar5 - dVar6) - dVar7) + dVar8;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,2);
  *pdVar4 = dVar8;
  return (SquareMatrix<double,_3> *)in_RDI;
}

Assistant:

SquareMatrix<Real, 3> toRotationMatrix3() {
      SquareMatrix<Real, 3> rotMat3;

      Real w2;
      Real x2;
      Real y2;
      Real z2;

      if (!this->isNormalized()) this->normalize();

      w2 = w() * w();
      x2 = x() * x();
      y2 = y() * y();
      z2 = z() * z();

      rotMat3(0, 0) = w2 + x2 - y2 - z2;
      rotMat3(0, 1) = 2.0 * (x() * y() + w() * z());
      rotMat3(0, 2) = 2.0 * (x() * z() - w() * y());

      rotMat3(1, 0) = 2.0 * (x() * y() - w() * z());
      rotMat3(1, 1) = w2 - x2 + y2 - z2;
      rotMat3(1, 2) = 2.0 * (y() * z() + w() * x());

      rotMat3(2, 0) = 2.0 * (x() * z() + w() * y());
      rotMat3(2, 1) = 2.0 * (y() * z() - w() * x());
      rotMat3(2, 2) = w2 - x2 - y2 + z2;

      return rotMat3;
    }